

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  Message *pMVar1;
  bool bVar2;
  uint32_t uVar3;
  OneofDescriptor *pOVar4;
  uint32_t *puVar5;
  Message **ppMVar6;
  MessageLite *pMVar7;
  char *description;
  Descriptor *pDVar8;
  Metadata MVar9;
  
  MVar9 = Message::GetMetadata(message);
  if (MVar9.reflection != this) {
    pDVar8 = this->descriptor_;
    MVar9 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar8,MVar9.descriptor,field,"ReleaseMessage");
  }
  pDVar8 = this->descriptor_;
  if (field->containing_type_ == pDVar8) {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (!bVar2) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
      }
      if ((field->field_0x1 & 8) == 0) {
        bVar2 = FieldDescriptor::is_repeated(field);
        if ((!bVar2) &&
           (pOVar4 = FieldDescriptor::real_containing_oneof(field), pOVar4 == (OneofDescriptor *)0x0
           )) {
          ClearHasBit(this,message,field);
        }
        pOVar4 = FieldDescriptor::real_containing_oneof(field);
        if (pOVar4 != (OneofDescriptor *)0x0) {
          bVar2 = HasOneofField(this,message,field);
          if (!bVar2) {
            return (Message *)0x0;
          }
          pOVar4 = FieldDescriptor::containing_oneof(field);
          puVar5 = MutableOneofCase(this,message,pOVar4);
          *puVar5 = 0;
        }
        ppMVar6 = MutableRaw<google::protobuf::Message*>(this,message,field);
        pMVar1 = *ppMVar6;
        *ppMVar6 = (Message *)0x0;
        return pMVar1;
      }
      if (factory == (MessageFactory *)0x0) {
        factory = this->message_factory_;
      }
      uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      pMVar7 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                          field,factory);
      return (Message *)pMVar7;
    }
    pDVar8 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar8,field,"ReleaseMessage",description);
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearHasBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}